

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cordz_handle.cc
# Opt level: O0

vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
* absl::lts_20250127::cord_internal::CordzHandle::DiagnosticsGetDeleteQueue(void)

{
  Queue *mu;
  vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  *in_RDI;
  __pointer_type local_48;
  CordzHandle *p;
  CordzHandle *dq_tail;
  MutexLock lock;
  Queue *global_queue;
  vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  *handles;
  
  std::
  vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
  ::vector(in_RDI);
  mu = anon_unknown_0::GlobalQueue();
  MutexLock::MutexLock((MutexLock *)&dq_tail,&mu->mutex);
  local_48 = std::atomic<absl::lts_20250127::cord_internal::CordzHandle_*>::load
                       (&mu->dq_tail,memory_order_acquire);
  p = local_48;
  for (; local_48 != (__pointer_type)0x0; local_48 = local_48->dq_prev_) {
    std::
    vector<const_absl::lts_20250127::cord_internal::CordzHandle_*,_std::allocator<const_absl::lts_20250127::cord_internal::CordzHandle_*>_>
    ::push_back(in_RDI,&local_48);
  }
  MutexLock::~MutexLock((MutexLock *)&dq_tail);
  return in_RDI;
}

Assistant:

std::vector<const CordzHandle*> CordzHandle::DiagnosticsGetDeleteQueue() {
  std::vector<const CordzHandle*> handles;
  Queue& global_queue = GlobalQueue();
  MutexLock lock(&global_queue.mutex);
  CordzHandle* dq_tail = global_queue.dq_tail.load(std::memory_order_acquire);
  for (const CordzHandle* p = dq_tail; p; p = p->dq_prev_) {
    handles.push_back(p);
  }
  return handles;
}